

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall TC_parser<false>::maybeFeature(TC_parser<false> *this)

{
  float fVar1;
  substring s;
  size_t sVar2;
  ulong uVar3;
  size_type sVar4;
  size_type sVar5;
  features **ppfVar6;
  float **ppfVar7;
  unsigned_long **ppuVar8;
  TC_parser<false> *in_RDI;
  float fVar9;
  substring sVar10;
  features *dict_fs;
  features *feats;
  uint64_t hash;
  feature_dict *map;
  size_t dict;
  uint64_t word_hash_1;
  substring spelling_ss;
  char d;
  char *c;
  features *spell_fs;
  substring affix_name;
  uint64_t len;
  uint64_t in_stack_000000c8;
  bool is_prefix;
  uint64_t affix;
  features *affix_fs;
  features *fs;
  uint64_t word_hash;
  substring feature_name;
  features *in_stack_fffffffffffffee8;
  v_array<unsigned_char> *in_stack_fffffffffffffef0;
  TC_parser<false> *in_stack_fffffffffffffef8;
  features *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  features *in_stack_ffffffffffffff20;
  features *pfVar11;
  features *in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff30;
  size_type local_c0;
  char *local_88;
  char *local_68;
  char *local_60;
  ulong local_48;
  char *local_18;
  char *local_10;
  
  if ((((*in_RDI->reading_head != ' ') && (*in_RDI->reading_head != '\t')) &&
      (*in_RDI->reading_head != '|')) &&
     ((in_RDI->reading_head != in_RDI->endLine && (*in_RDI->reading_head != '\r')))) {
    sVar10 = read_name(in_RDI);
    fVar1 = in_RDI->cur_channel_v;
    fVar9 = featureValue(in_stack_fffffffffffffef8);
    in_RDI->v = fVar1 * fVar9;
    local_10 = sVar10.end;
    local_18 = sVar10.begin;
    if (local_10 == local_18) {
      in_RDI->anon = in_RDI->anon + 1;
    }
    else {
      (*in_RDI->p->hasher)(sVar10,in_RDI->channel_hash);
    }
    if ((in_RDI->v != 0.0) || (NAN(in_RDI->v))) {
      features::push_back(in_stack_ffffffffffffff00,
                          (feature_value)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                          (feature_index)in_stack_fffffffffffffef0);
      if ((in_RDI->affix_features[in_RDI->index] != 0) && (local_10 != local_18)) {
        sVar2 = features::size((features *)0x3d6383);
        if (sVar2 == 0) {
          v_array<unsigned_char>::push_back
                    (in_stack_fffffffffffffef0,(uchar *)in_stack_fffffffffffffee8);
        }
        for (local_48 = in_RDI->affix_features[in_RDI->index]; local_48 != 0;
            local_48 = local_48 >> 4) {
          uVar3 = local_48 >> 1 & 7;
          local_68 = local_18;
          local_60 = local_10;
          if (local_18 + uVar3 < local_10) {
            if ((local_48 & 1) == 0) {
              local_68 = local_10 + -uVar3;
            }
            else {
              local_60 = local_18 + uVar3;
            }
          }
          sVar10.end = local_60;
          sVar10.begin = local_68;
          (*in_RDI->p->hasher)(sVar10,in_RDI->channel_hash);
          features::push_back(in_stack_ffffffffffffff00,
                              (feature_value)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                              (feature_index)in_stack_fffffffffffffef0);
        }
      }
      if ((in_RDI->spelling_features[in_RDI->index] & 1U) != 0) {
        sVar2 = features::size((features *)0x3d6561);
        if (sVar2 == 0) {
          v_array<unsigned_char>::push_back
                    (in_stack_fffffffffffffef0,(uchar *)in_stack_fffffffffffffee8);
        }
        v_array<char>::clear((v_array<char> *)in_stack_fffffffffffffef0);
        for (local_88 = local_18; local_88 != local_10; local_88 = local_88 + 1) {
          v_array<char>::push_back
                    ((v_array<char> *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
        }
        v_array<char>::begin(&in_RDI->spelling);
        v_array<char>::end(&in_RDI->spelling);
        s.end = in_stack_ffffffffffffff08;
        s.begin = (char *)in_stack_ffffffffffffff00;
        hashstring(s,(uint64_t)in_stack_fffffffffffffef8);
        features::push_back(in_stack_ffffffffffffff00,
                            (feature_value)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                            (feature_index)in_stack_fffffffffffffef0);
      }
      sVar4 = std::
              vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
              ::size(in_RDI->namespace_dictionaries + in_RDI->index);
      if (sVar4 != 0) {
        local_c0 = 0;
        while (sVar4 = local_c0,
              sVar5 = std::
                      vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                      ::size(in_RDI->namespace_dictionaries + in_RDI->index), sVar4 < sVar5) {
          std::
          vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
          ::operator[](in_RDI->namespace_dictionaries + in_RDI->index,local_c0);
          in_stack_ffffffffffffff30 =
               (void *)uniform_hash(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                                    (uint64_t)in_stack_ffffffffffffff20);
          ppfVar6 = v_hashmap<substring,_features_*>::get
                              ((v_hashmap<substring,_features_*> *)affix_fs,(substring *)affix,
                               in_stack_000000c8);
          in_stack_ffffffffffffff28 = *ppfVar6;
          if ((in_stack_ffffffffffffff28 != (features *)0x0) &&
             (sVar2 = v_array<float>::size(&in_stack_ffffffffffffff28->values), sVar2 != 0)) {
            pfVar11 = (in_RDI->ae->super_example_predict).feature_space + 0x87;
            sVar2 = features::size((features *)0x3d682c);
            if (sVar2 == 0) {
              v_array<unsigned_char>::push_back
                        (in_stack_fffffffffffffef0,(uchar *)in_stack_fffffffffffffee8);
            }
            in_stack_fffffffffffffee8 = pfVar11;
            in_stack_ffffffffffffff20 = in_stack_fffffffffffffee8;
            ppfVar7 = v_array<float>::begin(&in_stack_ffffffffffffff28->values);
            in_stack_fffffffffffffef0 = (v_array<unsigned_char> *)*ppfVar7;
            v_array<float>::size(&in_stack_ffffffffffffff28->values);
            push_many<float>(&in_stack_ffffffffffffff00->values,(float *)in_stack_fffffffffffffef8,
                             (size_t)in_stack_fffffffffffffef0);
            in_stack_fffffffffffffef8 = (TC_parser<false> *)&in_stack_ffffffffffffff20->indicies;
            ppuVar8 = v_array<unsigned_long>::begin(&in_stack_ffffffffffffff28->indicies);
            in_stack_ffffffffffffff00 = (features *)*ppuVar8;
            v_array<unsigned_long>::size(&in_stack_ffffffffffffff28->indicies);
            push_many<unsigned_long>
                      ((v_array<unsigned_long> *)in_stack_ffffffffffffff00,
                       (unsigned_long *)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0)
            ;
            in_stack_ffffffffffffff20->sum_feat_sq =
                 in_stack_ffffffffffffff28->sum_feat_sq + in_stack_ffffffffffffff20->sum_feat_sq;
          }
          local_c0 = local_c0 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

inline void maybeFeature()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
    {
      // maybeFeature --> ø
    }
    else
    {
      // maybeFeature --> 'String' FeatureValue
      substring feature_name = read_name();
      v = cur_channel_v * featureValue();
      uint64_t word_hash;
      if (feature_name.end != feature_name.begin)
        word_hash = (p->hasher(feature_name, channel_hash));
      else
        word_hash = channel_hash + anon++;
      if (v == 0)
        return;  // dont add 0 valued features to list of features
      features& fs = ae->feature_space[index];
      fs.push_back(v, word_hash);
      if (audit)
      {
        v_array<char> feature_v = v_init<char>();
        push_many(feature_v, feature_name.begin, feature_name.end - feature_name.begin);
        feature_v.push_back('\0');
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(base, feature_v.begin())));
        feature_v.delete_v();
      }
      if ((affix_features[index] > 0) && (feature_name.end != feature_name.begin))
      {
        features& affix_fs = ae->feature_space[affix_namespace];
        if (affix_fs.size() == 0)
          ae->indices.push_back(affix_namespace);
        uint64_t affix = affix_features[index];
        while (affix > 0)
        {
          bool is_prefix = affix & 0x1;
          uint64_t len = (affix >> 1) & 0x7;
          substring affix_name = {feature_name.begin, feature_name.end};
          if (affix_name.end > affix_name.begin + len)
          {
            if (is_prefix)
              affix_name.end = affix_name.begin + len;
            else
              affix_name.begin = affix_name.end - len;
          }
          word_hash =
              p->hasher(affix_name, (uint64_t)channel_hash) * (affix_constant + (affix & 0xF) * quadratic_constant);
          affix_fs.push_back(v, word_hash);
          if (audit)
          {
            v_array<char> affix_v = v_init<char>();
            if (index != ' ')
              affix_v.push_back(index);
            affix_v.push_back(is_prefix ? '+' : '-');
            affix_v.push_back('0' + (char)len);
            affix_v.push_back('=');
            push_many(affix_v, affix_name.begin, affix_name.end - affix_name.begin);
            affix_v.push_back('\0');
            affix_fs.space_names.push_back(audit_strings_ptr(new audit_strings("affix", affix_v.begin())));
          }
          affix >>= 4;
        }
      }
      if (spelling_features[index])
      {
        features& spell_fs = ae->feature_space[spelling_namespace];
        if (spell_fs.size() == 0)
          ae->indices.push_back(spelling_namespace);
        // v_array<char> spelling;
        spelling.clear();
        for (char* c = feature_name.begin; c != feature_name.end; ++c)
        {
          char d = 0;
          if ((*c >= '0') && (*c <= '9'))
            d = '0';
          else if ((*c >= 'a') && (*c <= 'z'))
            d = 'a';
          else if ((*c >= 'A') && (*c <= 'Z'))
            d = 'A';
          else if (*c == '.')
            d = '.';
          else
            d = '#';
          // if ((spelling.size() == 0) || (spelling.last() != d))
          spelling.push_back(d);
        }
        substring spelling_ss = {spelling.begin(), spelling.end()};
        uint64_t word_hash = hashstring(spelling_ss, (uint64_t)channel_hash);
        spell_fs.push_back(v, word_hash);
        if (audit)
        {
          v_array<char> spelling_v = v_init<char>();
          if (index != ' ')
          {
            spelling_v.push_back(index);
            spelling_v.push_back('_');
          }
          push_many(spelling_v, spelling_ss.begin, spelling_ss.end - spelling_ss.begin);
          spelling_v.push_back('\0');
          spell_fs.space_names.push_back(audit_strings_ptr(new audit_strings("spelling", spelling_v.begin())));
        }
      }
      if (namespace_dictionaries[index].size() > 0)
      {
        for (size_t dict = 0; dict < namespace_dictionaries[index].size(); dict++)
        {
          feature_dict* map = namespace_dictionaries[index][dict];
          uint64_t hash = uniform_hash(feature_name.begin, feature_name.end - feature_name.begin, quadratic_constant);
          features* feats = map->get(feature_name, hash);
          if ((feats != nullptr) && (feats->values.size() > 0))
          {
            features& dict_fs = ae->feature_space[dictionary_namespace];
            if (dict_fs.size() == 0)
              ae->indices.push_back(dictionary_namespace);
            push_many(dict_fs.values, feats->values.begin(), feats->values.size());
            push_many(dict_fs.indicies, feats->indicies.begin(), feats->indicies.size());
            dict_fs.sum_feat_sq += feats->sum_feat_sq;
            if (audit)
              for (size_t i = 0; i < feats->indicies.size(); ++i)
              {
                uint64_t id = feats->indicies[i];
                stringstream ss;
                ss << index << '_';
                for (char* fc = feature_name.begin; fc != feature_name.end; ++fc) ss << *fc;
                ss << '=' << id;
                dict_fs.space_names.push_back(audit_strings_ptr(new audit_strings("dictionary", ss.str())));
              }
          }
        }
      }
    }
  }